

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O1

SPxId __thiscall soplex::SPxParMultPR<double>::selectEnter(SPxParMultPR<double> *this)

{
  DataKey *pDVar1;
  int iVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pSVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  pointer pSVar8;
  long lVar9;
  SPxId SVar10;
  DataKey DVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  double *pdVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  double local_48;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  local_48 = -(this->super_SPxPricer<double>).thetolerance;
  if (pSVar3->thePricing == PARTIAL) {
    iVar14 = this->last;
    lVar18 = (long)this->used;
    if (0 < lVar18) {
      lVar17 = lVar18 + 1;
      lVar18 = lVar18 << 4;
      do {
        iVar7 = SPxLPBase<double>::number
                          (&((this->super_SPxPricer<double>).thesolver)->super_SPxLPBase<double>,
                           (SPxId *)((long)&(this->pricSet).data.
                                            super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].id.
                                            super_DataKey + lVar18));
        pSVar3 = (this->super_SPxPricer<double>).thesolver;
        pSVar8 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pSVar3->theRep * *(int *)((long)&pSVar8[-1].id.super_DataKey + lVar18) < 1) {
          dVar19 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar7];
        }
        else {
          SPxSolverBase<double>::computePvec(pSVar3,iVar7);
          dVar19 = SPxSolverBase<double>::computeTest
                             ((this->super_SPxPricer<double>).thesolver,iVar7);
          pSVar8 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        *(double *)((long)&pSVar8[-1].test + lVar18) = dVar19;
        if (local_48 <= dVar19) {
          lVar9 = (long)this->used + -1;
          this->used = (int)lVar9;
          pSVar4 = (this->pricSet).data.
                   super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar8 = pSVar4 + lVar9;
          DVar11 = (DataKey)pSVar8->test;
          pDVar1 = (DataKey *)((long)&pSVar4[-1].id.super_DataKey + lVar18);
          *pDVar1 = (pSVar8->id).super_DataKey;
          pDVar1[1] = DVar11;
        }
        lVar17 = lVar17 + -1;
        lVar18 = lVar18 + -0x10;
      } while (1 < lVar17);
    }
    while( true ) {
      pSVar8 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = this->used;
      if (this->partialSize <=
          (int)((int)((ulong)((long)(this->pricSet).data.
                                    super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8) >> 4)
               - uVar13)) break;
      if ((int)uVar13 < 2) {
        lVar18 = 0;
      }
      else {
        pdVar15 = &pSVar8[1].test;
        uVar16 = 0;
        uVar12 = 1;
        do {
          uVar6 = uVar12 & 0xffffffff;
          if (*pdVar15 < pSVar8[(int)uVar16].test || *pdVar15 == pSVar8[(int)uVar16].test) {
            uVar6 = uVar16;
          }
          uVar16 = uVar6;
          uVar12 = uVar12 + 1;
          pdVar15 = pdVar15 + 2;
        } while (uVar13 != uVar12);
        lVar18 = (long)(int)uVar16;
      }
      this->used = uVar13 - 1;
      dVar19 = pSVar8[(long)(int)uVar13 + -1].test;
      pSVar8[lVar18].id.super_DataKey = pSVar8[(long)(int)uVar13 + -1].id.super_DataKey;
      pSVar8[lVar18].test = dVar19;
    }
    do {
      uVar13 = (this->last + 1) % this->multiParts;
      this->last = uVar13;
      for (iVar7 = ~uVar13 + (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum;
          -1 < iVar7; iVar7 = iVar7 - this->multiParts) {
        SPxSolverBase<double>::computePvec((this->super_SPxPricer<double>).thesolver,iVar7);
        dVar19 = SPxSolverBase<double>::computeTest((this->super_SPxPricer<double>).thesolver,iVar7)
        ;
        if (dVar19 < local_48) {
          SVar10 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,iVar7);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar10.super_DataKey;
          iVar2 = this->used;
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar2].test = dVar19;
          this->used = iVar2 + 1;
        }
      }
      for (uVar13 = ~this->last +
                    (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
          -1 < (int)uVar13; uVar13 = uVar13 - this->multiParts) {
        pSVar3 = (this->super_SPxPricer<double>).thesolver;
        dVar19 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar13];
        if (dVar19 < local_48) {
          SVar10 = SPxSolverBase<double>::coId(pSVar3,uVar13);
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[this->used].id.super_DataKey =
               SVar10.super_DataKey;
          iVar7 = this->used;
          (this->pricSet).data.
          super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar7].test = dVar19;
          this->used = iVar7 + 1;
        }
      }
      uVar13 = this->used;
    } while (((int)uVar13 < this->min) && (this->last != iVar14));
    if ((int)uVar13 < 1) {
      DVar11.info = 0;
      DVar11.idx = 0;
      uVar12 = 0xffffffff;
    }
    else {
      iVar14 = this->partialSize;
      if ((int)(uVar13 + 1) < this->partialSize) {
        iVar14 = uVar13 + 1;
      }
      this->min = iVar14;
      uVar12 = 0;
      if ((ulong)uVar13 != 1) {
        pSVar8 = (this->pricSet).data.
                 super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar15 = &pSVar8[1].test;
        uVar16 = 1;
        do {
          dVar19 = pSVar8[(int)uVar12].test;
          uVar6 = uVar16 & 0xffffffff;
          if (dVar19 < *pdVar15 || dVar19 == *pdVar15) {
            uVar6 = uVar12;
          }
          uVar12 = uVar6;
          uVar16 = uVar16 + 1;
          pdVar15 = pdVar15 + 2;
        } while (uVar13 != uVar16);
        uVar12 = (ulong)(int)uVar12;
      }
      DVar11 = (this->pricSet).data.
               super__Vector_base<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp,_std::allocator<soplex::SPxParMultPR<double>::SPxParMultPr_Tmp>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].id.super_DataKey;
      uVar12 = (ulong)DVar11 >> 0x20;
    }
  }
  else {
    lVar18 = (long)(pSVar3->thecovectors->set).thenum;
    if (lVar18 < 1) {
      DVar11.info = 0;
      DVar11.idx = 0;
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = 0xffffffff;
      DVar11.info = 0;
      DVar11.idx = 0;
      do {
        pSVar3 = (this->super_SPxPricer<double>).thesolver;
        pdVar15 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar18 + -1;
        if (*pdVar15 <= local_48 && local_48 != *pdVar15) {
          DVar11 = (DataKey)SPxSolverBase<double>::coId(pSVar3,(int)lVar18 + -1);
          uVar12 = (ulong)DVar11 >> 0x20;
          local_48 = (((this->super_SPxPricer<double>).thesolver)->theCoTest).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18 + -1];
        }
        bVar5 = 1 < lVar18;
        lVar18 = lVar18 + -1;
      } while (bVar5);
    }
    lVar18 = (long)(((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum;
    if (0 < lVar18) {
      do {
        pSVar3 = (this->super_SPxPricer<double>).thesolver;
        pdVar15 = (pSVar3->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar18 + -1;
        if (*pdVar15 <= local_48 && local_48 != *pdVar15) {
          DVar11 = (DataKey)SPxSolverBase<double>::id(pSVar3,(int)lVar18 + -1);
          uVar12 = (ulong)DVar11 >> 0x20;
          local_48 = (((this->super_SPxPricer<double>).thesolver)->theTest).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18 + -1];
        }
        bVar5 = 1 < lVar18;
        lVar18 = lVar18 + -1;
      } while (bVar5);
    }
  }
  return (SPxId)((ulong)DVar11 & 0xffffffff | uVar12 << 0x20);
}

Assistant:

SPxId SPxParMultPR<R>::selectEnter()
{
   SPxId id;
   R x;
   int i;
   int best = -1;
   //    const SPxBasisBase<R>::Desc& ds   = this->thesolver->basis().desc();

   assert(this->thesolver != nullptr);
   int lastlast = -1;

   if(this->thesolver->pricing() == SPxSolverBase<R>::PARTIAL)
   {
      R val;
      R tol = -this->thetolerance;
      lastlast = last;

      for(i = used - 1; i >= 0; --i)
      {
         int n = this->thesolver->number(pricSet[i].id);

         if(this->thesolver->isId(pricSet[i].id))
         {
            this->thesolver->computePvec(n);
            pricSet[i].test = val = this->thesolver->computeTest(n);
         }
         else
            pricSet[i].test = val = this->thesolver->coTest()[n];

         if(val >= tol)
            pricSet[i] = pricSet[--used];
      }

      while(pricSet.size() - used < partialSize)
      {
         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test > pricSet[best].test)
               best = i;
         }

         pricSet[best] = pricSet[--used];
      }

      do
      {
         last = (last + 1) % multiParts;

         for(i = this->thesolver->coDim() - last - 1;
               i >= 0; i -= multiParts)
         {
            this->thesolver->computePvec(i);
            x = this->thesolver->computeTest(i);

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->id(i);
               pricSet[used].test = x;
               used++;
            }
         }

         for(i = this->thesolver->dim() - last - 1;
               i >= 0; i -= multiParts)
         {
            x = this->thesolver->coTest()[i];

            if(x < tol)
            {
               pricSet[used].id = this->thesolver->coId(i);
               pricSet[used].test = x;
               used++;
            }
         }

         assert(used < pricSet.size());
      }
      while(used < min && last != lastlast);

      if(used > 0)
      {
         min = (used + 1);

         if(min < 1)
            min = 1;

         if(min > partialSize)
            min = partialSize;

         best = 0;

         for(i = 1; i < used; ++i)
         {
            if(pricSet[i].test < pricSet[best].test)
               best = i;
         }

         id = pricSet[best].id;
      }

      return id;
   }

   else
   {
      assert(this->thesolver->pricing() == SPxSolverBase<R>::FULL);
      R bestx = -this->thetolerance;

      for(i = this->thesolver->dim() - 1; i >= 0; --i)
      {
         x = this->thesolver->coTest()[i];

         // x *= EQ_PREF * (1 + (ds.coStatus(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.coStatus(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->coId(i);
            bestx = this->thesolver->coTest()[i];
         }
      }

      for(i = this->thesolver->coDim() - 1; i >= 0; --i)
      {
         x = this->thesolver->test()[i];

         // x *= EQ_PREF * (1 + (ds.status(i) == SPxBasisBase<R>::Desc::P_FREE
         //                || ds.status(i) == SPxBasisBase<R>::Desc::D_FREE));
         if(x < bestx)
         {
            id = this->thesolver->id(i);
            bestx = this->thesolver->test()[i];
         }
      }

      return id;
   }
}